

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_data.hpp
# Opt level: O0

vector<duckdb::MultiFileColumnDefinition,_true> *
duckdb::MultiFileColumnDefinition::ColumnsFromNamesAndTypes
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *names,vector<duckdb::LogicalType,_true> *types)

{
  size_type sVar1;
  string *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<duckdb::MultiFileColumnDefinition,_true> *in_RDI;
  value_type *type;
  value_type *name;
  idx_t i;
  vector<duckdb::MultiFileColumnDefinition,_true> *columns;
  value_type *in_stack_fffffffffffffef8;
  MultiFileColumnDefinition *in_stack_ffffffffffffff00;
  undefined8 local_28;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  
  uVar2 = 0;
  vector<duckdb::MultiFileColumnDefinition,_true>::vector
            ((vector<duckdb::MultiFileColumnDefinition,_true> *)0x14c90d9);
  for (local_28 = 0;
      sVar1 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RSI), local_28 < sVar1; local_28 = local_28 + 1) {
    in_stack_ffffffffffffff00 =
         (MultiFileColumnDefinition *)
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       *)in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef8 =
         (value_type *)
         vector<duckdb::LogicalType,_true>::operator[]
                   ((vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff00,
                    (size_type)in_stack_fffffffffffffef8);
    CreateFromNameAndType(in_RDX,(LogicalType *)CONCAT17(uVar2,in_stack_ffffffffffffffe0));
    ::std::
    vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>::
    push_back((vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
               *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    ~MultiFileColumnDefinition(in_stack_ffffffffffffff00);
  }
  return in_RDI;
}

Assistant:

static vector<MultiFileColumnDefinition> ColumnsFromNamesAndTypes(const vector<string> &names,
	                                                                  const vector<LogicalType> &types) {
		vector<MultiFileColumnDefinition> columns;
		D_ASSERT(names.size() == types.size());
		for (idx_t i = 0; i < names.size(); i++) {
			auto &name = names[i];
			auto &type = types[i];
			columns.push_back(CreateFromNameAndType(name, type));
		}
		return columns;
	}